

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::Canceler::cancel(Canceler *this,Exception *exception)

{
  AdapterBase *this_00;
  Exception *__name;
  Exception local_1b0;
  
  __name = exception;
  while (this_00 = (this->list).ptr, this_00 != (AdapterBase *)0x0) {
    AdapterBase::unlink(this_00,(char *)__name);
    Exception::Exception(&local_1b0,exception);
    __name = &local_1b0;
    (**this_00->_vptr_AdapterBase)(this_00);
    Exception::~Exception(&local_1b0);
  }
  return;
}

Assistant:

void Canceler::cancel(const Exception& exception) {
  for (;;) {
    KJ_IF_SOME(a, list) {
      a.unlink();
      a.cancel(kj::cp(exception));
    } else {
      break;
    }
  }